

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckInputLabel(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  int iVar2;
  ctmbstr cp;
  char *pcVar3;
  AttVal *pAVar4;
  
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
    for (pAVar4 = node->attributes; pAVar4 != (AttVal *)0x0; pAVar4 = pAVar4->next) {
      if (((pAVar4->dict != (Attribute *)0x0) && (pAVar4->dict->id == TidyAttr_ID)) &&
         (pcVar3 = pAVar4->value, pcVar3 != (char *)0x0)) {
        do {
          if (*pcVar3 == '\0') goto LAB_0015272c;
          BVar1 = prvTidyIsWhite((int)*pcVar3);
          pcVar3 = pcVar3 + 1;
        } while (BVar1 != no);
        (doc->access).HasValidId = yes;
      }
LAB_0015272c:
    }
    iVar2 = (doc->access).ForID + 1;
    (doc->access).ForID = iVar2;
    if (iVar2 == 2) {
      (doc->access).ForID = 0;
      CheckFormControls(doc,node);
      return;
    }
  }
  return;
}

Assistant:

static void CheckInputLabel( TidyDocImpl* doc, Node* node )
{
    if (Level2_Enabled( doc ))
    {
        AttVal* av;

        /* Checks attributes within the INPUT element */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            /* Must have valid 'ID' value */
            if ( attrIsID(av) && hasValue(av) )
                doc->access.HasValidId = yes;
        }

        if ( ++doc->access.ForID == 2 )
        {
            doc->access.ForID = 0;
            CheckFormControls( doc, node );
        }
    }
}